

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  bool bVar1;
  Type TVar2;
  MessageOptions *this_00;
  Descriptor *pDVar3;
  Descriptor *pDVar4;
  string *psVar5;
  TextGenerator *generator_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  bVar1 = FieldDescriptor::is_extension(field);
  if (!bVar1) {
    TVar2 = FieldDescriptor::type(field);
    if (TVar2 == TYPE_GROUP) {
      pDVar4 = FieldDescriptor::message_type(field);
      psVar5 = Descriptor::name_abi_cxx11_(pDVar4);
      TextGenerator::Print(generator,psVar5);
      return;
    }
    psVar5 = FieldDescriptor::name_abi_cxx11_(field);
    TextGenerator::Print(generator,psVar5);
    return;
  }
  TextGenerator::Print(generator,"[");
  pDVar4 = FieldDescriptor::containing_type(field);
  this_00 = Descriptor::options(pDVar4);
  bVar1 = MessageOptions::message_set_wire_format(this_00);
  if (((bVar1) && (TVar2 = FieldDescriptor::type(field), TVar2 == TYPE_MESSAGE)) &&
     (bVar1 = FieldDescriptor::is_optional(field), bVar1)) {
    pDVar4 = FieldDescriptor::extension_scope(field);
    pDVar3 = FieldDescriptor::message_type(field);
    if (pDVar4 == pDVar3) {
      pDVar4 = FieldDescriptor::message_type(field);
      psVar5 = Descriptor::full_name_abi_cxx11_(pDVar4);
      TextGenerator::Print(generator,psVar5);
      goto LAB_002c3990;
    }
  }
  psVar5 = FieldDescriptor::full_name_abi_cxx11_(field);
  TextGenerator::Print(generator,psVar5);
LAB_002c3990:
  TextGenerator::Print(generator,"]");
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator& generator) const {
  if (field->is_extension()) {
    generator.Print("[");
    // We special-case MessageSet elements for compatibility with proto1.
    if (field->containing_type()->options().message_set_wire_format()
        && field->type() == FieldDescriptor::TYPE_MESSAGE
        && field->is_optional()
        && field->extension_scope() == field->message_type()) {
      generator.Print(field->message_type()->full_name());
    } else {
      generator.Print(field->full_name());
    }
    generator.Print("]");
  } else {
    if (field->type() == FieldDescriptor::TYPE_GROUP) {
      // Groups must be serialized with their original capitalization.
      generator.Print(field->message_type()->name());
    } else {
      generator.Print(field->name());
    }
  }
}